

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O3

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::MergeMessage
          (FieldMaskTree *this,Node *node,Message *source,MergeOptions *options,Message *destination
          )

{
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  bVar1;
  byte bVar2;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  *pbVar3;
  pointer pcVar4;
  size_type sVar5;
  Node *this_00;
  char *pcVar6;
  bool bVar7;
  int32_t iVar8;
  int iVar9;
  uint32_t uVar10;
  uint uVar11;
  Descriptor *this_01;
  reference ppVar12;
  FieldDescriptor *field;
  Node *node_00;
  MergeOptions *options_00;
  LogMessage *pLVar13;
  Message *pMVar14;
  Message *pMVar15;
  uint64_t uVar16;
  EnumValueDescriptor *pEVar17;
  int64_t iVar18;
  byte bVar19;
  Reflection *this_02;
  Reflection *this_03;
  int iVar20;
  uint index;
  float fVar21;
  double dVar22;
  Metadata MVar23;
  const_iterator cVar24;
  const_iterator other;
  string_view name;
  const_iterator other_00;
  string_view str;
  string_view v;
  string_view str_00;
  string_view v_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view v_01;
  string_view str_04;
  string_view v_02;
  LogMessage local_98;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
  local_88;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  *local_78;
  string local_70;
  string local_50;
  
  if ((this->root_).children.
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
      .tree_.size_ == 0) {
LAB_00fc5b30:
    util::_GLOBAL__N_1::FieldMaskTree::MergeMessage((FieldMaskTree *)&local_98);
  }
  else {
    MVar23 = Message::GetMetadata((Message *)node);
    this_02 = MVar23.reflection;
    MVar23 = Message::GetMetadata((Message *)options);
    this_03 = MVar23.reflection;
    MVar23 = Message::GetMetadata((Message *)node);
    this_01 = MVar23.descriptor;
    cVar24 = absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
             ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                      *)(this->root_).children.
                        super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                        .
                        super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                        .
                        super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
                        .tree_.root_);
    local_88.node_ = cVar24.node_;
    local_88.position_ = cVar24.position_;
    pbVar3 = (this->root_).children.
             super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
             .
             super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
             .
             super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_>
             .tree_.rightmost_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::StringBtreeDefaultLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
             .
             super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>_*,_2UL,_false>
             .value;
    if (((ulong)pbVar3 & 7) == 0) {
      bVar1 = pbVar3[10];
      other.position_._0_1_ = bVar1;
      other.node_ = pbVar3;
      other._9_7_ = 0;
      bVar7 = absl::lts_20250127::container_internal::
              btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
              ::Equals(&local_88,other);
      local_78 = pbVar3;
      do {
        if (bVar7) {
          return;
        }
        ppVar12 = absl::lts_20250127::container_internal::
                  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
                  ::operator*(&local_88);
        pcVar4 = (ppVar12->first)._M_dataplus._M_p;
        sVar5 = (ppVar12->first)._M_string_length;
        this_00 = (ppVar12->second)._M_t.
                  super___uniq_ptr_impl<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>
                  .
                  super__Head_base<0UL,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*,_false>
                  ._M_head_impl;
        name._M_str = pcVar4;
        name._M_len = sVar5;
        field = Descriptor::FindFieldByName(this_01,name);
        if (field == (FieldDescriptor *)0x0) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_mask_util.cc"
                     ,0x1b7);
          str_03._M_str = "Cannot find field \"";
          str_03._M_len = 0x13;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (&local_98,str_03);
          v_01._M_str = pcVar4;
          v_01._M_len = sVar5;
          pLVar13 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_98,v_01);
          str_04._M_str = "\" in message ";
          str_04._M_len = 0xd;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar13,str_04);
          pcVar6 = (this_01->all_names_).payload_;
          v_02._M_len = (ulong)*(ushort *)(pcVar6 + 2);
          v_02._M_str = pcVar6 + ~v_02._M_len;
          absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar13,v_02);
LAB_00fc548d:
          absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_98);
        }
        else {
          bVar2 = field->field_0x1;
          bVar19 = 0xbf < bVar2 ^ (bVar2 & 0x20) >> 5;
          if (*(size_type *)((long)&((Node *)&this_00->children)->children + 0x10) != 0) {
            if (bVar19 != 0) {
              util::_GLOBAL__N_1::FieldMaskTree::MergeMessage();
              goto LAB_00fc5b1b;
            }
            if (((bVar2 & 0x20) == 0) &&
               (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) {
              node_00 = (Node *)Reflection::GetMessage
                                          (this_02,(Message *)node,field,(MessageFactory *)0x0);
              options_00 = (MergeOptions *)
                           Reflection::MutableMessage
                                     (this_03,(Message *)options,field,(MessageFactory *)0x0);
              MergeMessage((FieldMaskTree *)this_00,node_00,source,options_00,destination);
              goto switchD_00fc52b2_default;
            }
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_mask_util.cc"
                       ,0x1bf);
            str._M_str = "Field \"";
            str._M_len = 7;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_98,str);
            v._M_str = pcVar4;
            v._M_len = sVar5;
            pLVar13 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_98,v);
            str_00._M_str = "\" in message ";
            str_00._M_len = 0xd;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (pLVar13,str_00);
            pcVar6 = (this_01->all_names_).payload_;
            v_00._M_len = (ulong)*(ushort *)(pcVar6 + 2);
            v_00._M_str = pcVar6 + ~v_00._M_len;
            pLVar13 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar13,v_00);
            str_01._M_str = " is not a singular message field and cannot ";
            str_01._M_len = 0x2c;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (pLVar13,str_01);
            str_02._M_str = "have sub-fields.";
            str_02._M_len = 0x10;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (pLVar13,str_02);
            goto LAB_00fc548d;
          }
          if (bVar19 != 0) {
LAB_00fc5b1b:
            util::_GLOBAL__N_1::FieldMaskTree::MergeMessage();
            goto LAB_00fc5b30;
          }
          if ((bVar2 & 0x20) == 0) {
            switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
            case 1:
              bVar7 = Reflection::HasField(this_02,(Message *)node,field);
              if (bVar7) {
                iVar8 = Reflection::GetInt32(this_02,(Message *)node,field);
                Reflection::SetInt32(this_03,(Message *)options,field,iVar8);
              }
              else {
LAB_00fc5af1:
                Reflection::ClearField(this_03,(Message *)options,field);
              }
              break;
            case 2:
              bVar7 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar7) goto LAB_00fc5af1;
              iVar18 = Reflection::GetInt64(this_02,(Message *)node,field);
              Reflection::SetInt64(this_03,(Message *)options,field,iVar18);
              break;
            case 3:
              bVar7 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar7) goto LAB_00fc5af1;
              uVar10 = Reflection::GetUInt32(this_02,(Message *)node,field);
              Reflection::SetUInt32(this_03,(Message *)options,field,uVar10);
              break;
            case 4:
              bVar7 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar7) goto LAB_00fc5af1;
              uVar16 = Reflection::GetUInt64(this_02,(Message *)node,field);
              Reflection::SetUInt64(this_03,(Message *)options,field,uVar16);
              break;
            case 5:
              bVar7 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar7) goto LAB_00fc5af1;
              dVar22 = Reflection::GetDouble(this_02,(Message *)node,field);
              Reflection::SetDouble(this_03,(Message *)options,field,dVar22);
              break;
            case 6:
              bVar7 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar7) goto LAB_00fc5af1;
              fVar21 = Reflection::GetFloat(this_02,(Message *)node,field);
              Reflection::SetFloat(this_03,(Message *)options,field,fVar21);
              break;
            case 7:
              bVar7 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar7) goto LAB_00fc5af1;
              bVar7 = Reflection::GetBool(this_02,(Message *)node,field);
              Reflection::SetBool(this_03,(Message *)options,field,bVar7);
              break;
            case 8:
              bVar7 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar7) goto LAB_00fc5af1;
              pEVar17 = Reflection::GetEnum(this_02,(Message *)node,field);
              Reflection::SetEnum(this_03,(Message *)options,field,pEVar17);
              break;
            case 9:
              bVar7 = Reflection::HasField(this_02,(Message *)node,field);
              if (!bVar7) goto LAB_00fc5af1;
              Reflection::GetString_abi_cxx11_(&local_50,this_02,(Message *)node,field);
              Reflection::SetString(this_03,(Message *)options,field,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              break;
            case 10:
              if (*(char *)&(source->super_MessageLite)._vptr_MessageLite == '\x01') {
                Reflection::ClearField(this_03,(Message *)options,field);
              }
              bVar7 = Reflection::HasField(this_02,(Message *)node,field);
              if (bVar7) {
                pMVar14 = Reflection::MutableMessage
                                    (this_03,(Message *)options,field,(MessageFactory *)0x0);
                pMVar15 = Reflection::GetMessage
                                    (this_02,(Message *)node,field,(MessageFactory *)0x0);
                Message::MergeFrom(pMVar14,pMVar15);
              }
            }
          }
          else {
            if (*(char *)((long)&(source->super_MessageLite)._vptr_MessageLite + 1) == '\x01') {
              Reflection::ClearField(this_03,(Message *)options,field);
            }
            switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
            case 1:
              iVar9 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar9) {
                iVar20 = 0;
                do {
                  iVar8 = Reflection::GetRepeatedInt32(this_02,(Message *)node,field,iVar20);
                  Reflection::AddInt32(this_03,(Message *)options,field,iVar8);
                  iVar20 = iVar20 + 1;
                } while (iVar9 != iVar20);
              }
              break;
            case 2:
              iVar9 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar9) {
                iVar20 = 0;
                do {
                  iVar18 = Reflection::GetRepeatedInt64(this_02,(Message *)node,field,iVar20);
                  Reflection::AddInt64(this_03,(Message *)options,field,iVar18);
                  iVar20 = iVar20 + 1;
                } while (iVar9 != iVar20);
              }
              break;
            case 3:
              iVar9 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar9) {
                iVar20 = 0;
                do {
                  uVar10 = Reflection::GetRepeatedUInt32(this_02,(Message *)node,field,iVar20);
                  Reflection::AddUInt32(this_03,(Message *)options,field,uVar10);
                  iVar20 = iVar20 + 1;
                } while (iVar9 != iVar20);
              }
              break;
            case 4:
              iVar9 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar9) {
                iVar20 = 0;
                do {
                  uVar16 = Reflection::GetRepeatedUInt64(this_02,(Message *)node,field,iVar20);
                  Reflection::AddUInt64(this_03,(Message *)options,field,uVar16);
                  iVar20 = iVar20 + 1;
                } while (iVar9 != iVar20);
              }
              break;
            case 5:
              iVar9 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar9) {
                iVar20 = 0;
                do {
                  dVar22 = Reflection::GetRepeatedDouble(this_02,(Message *)node,field,iVar20);
                  Reflection::AddDouble(this_03,(Message *)options,field,dVar22);
                  iVar20 = iVar20 + 1;
                } while (iVar9 != iVar20);
              }
              break;
            case 6:
              iVar9 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar9) {
                iVar20 = 0;
                do {
                  fVar21 = Reflection::GetRepeatedFloat(this_02,(Message *)node,field,iVar20);
                  Reflection::AddFloat(this_03,(Message *)options,field,fVar21);
                  iVar20 = iVar20 + 1;
                } while (iVar9 != iVar20);
              }
              break;
            case 7:
              iVar9 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar9) {
                iVar20 = 0;
                do {
                  bVar7 = Reflection::GetRepeatedBool(this_02,(Message *)node,field,iVar20);
                  Reflection::AddBool(this_03,(Message *)options,field,bVar7);
                  iVar20 = iVar20 + 1;
                } while (iVar9 != iVar20);
              }
              break;
            case 8:
              iVar9 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar9) {
                iVar20 = 0;
                do {
                  pEVar17 = Reflection::GetRepeatedEnum(this_02,(Message *)node,field,iVar20);
                  Reflection::AddEnum(this_03,(Message *)options,field,pEVar17);
                  iVar20 = iVar20 + 1;
                } while (iVar9 != iVar20);
              }
              break;
            case 9:
              uVar11 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < (int)uVar11) {
                index = 0;
                do {
                  destination = (Message *)(ulong)index;
                  Reflection::GetRepeatedString_abi_cxx11_
                            (&local_70,this_02,(Message *)node,field,index);
                  Reflection::AddString(this_03,(Message *)options,field,&local_70);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_70._M_dataplus._M_p != &local_70.field_2) {
                    operator_delete(local_70._M_dataplus._M_p,
                                    local_70.field_2._M_allocated_capacity + 1);
                  }
                  index = index + 1;
                } while (uVar11 != index);
              }
              break;
            case 10:
              iVar9 = Reflection::FieldSize(this_02,(Message *)node,field);
              if (0 < iVar9) {
                iVar20 = 0;
                do {
                  pMVar14 = Reflection::AddMessage
                                      (this_03,(Message *)options,field,(MessageFactory *)0x0);
                  pMVar15 = Reflection::GetRepeatedMessage(this_02,(Message *)node,field,iVar20);
                  Message::MergeFrom(pMVar14,pMVar15);
                  iVar20 = iVar20 + 1;
                } while (iVar9 != iVar20);
              }
            }
          }
        }
switchD_00fc52b2_default:
        absl::lts_20250127::container_internal::
        btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
        ::operator++(&local_88);
        other_00.position_._0_1_ = bVar1;
        other_00.node_ = local_78;
        other_00._9_7_ = 0;
        bVar7 = absl::lts_20250127::container_internal::
                btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_*>
                ::Equals(&local_88,other_00);
      } while( true );
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_stri..." /* TRUNCATED STRING LITERAL */
               );
}

Assistant:

void FieldMaskTree::MergeMessage(const Node* node, const Message& source,
                                 const FieldMaskUtil::MergeOptions& options,
                                 Message* destination) {
  ABSL_DCHECK(!node->children.empty());
  const Reflection* source_reflection = source.GetReflection();
  const Reflection* destination_reflection = destination->GetReflection();
  const Descriptor* descriptor = source.GetDescriptor();
  for (const auto& kv : node->children) {
    absl::string_view field_name = kv.first;
    const Node* child = kv.second.get();
    const FieldDescriptor* field = descriptor->FindFieldByName(field_name);
    if (field == nullptr) {
      ABSL_LOG(ERROR) << "Cannot find field \"" << field_name
                      << "\" in message " << descriptor->full_name();
      continue;
    }
    if (!child->children.empty()) {
      // Sub-paths are only allowed for singular message fields.
      if (field->is_repeated() ||
          field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        ABSL_LOG(ERROR) << "Field \"" << field_name << "\" in message "
                        << descriptor->full_name()
                        << " is not a singular message field and cannot "
                        << "have sub-fields.";
        continue;
      }
      MergeMessage(child, source_reflection->GetMessage(source, field), options,
                   destination_reflection->MutableMessage(destination, field));
      continue;
    }
    if (!field->is_repeated()) {
      switch (field->cpp_type()) {
#define COPY_VALUE(TYPE, Name)                                              \
  case FieldDescriptor::CPPTYPE_##TYPE: {                                   \
    if (source_reflection->HasField(source, field)) {                       \
      destination_reflection->Set##Name(                                    \
          destination, field, source_reflection->Get##Name(source, field)); \
    } else {                                                                \
      destination_reflection->ClearField(destination, field);               \
    }                                                                       \
    break;                                                                  \
  }
        COPY_VALUE(BOOL, Bool)
        COPY_VALUE(INT32, Int32)
        COPY_VALUE(INT64, Int64)
        COPY_VALUE(UINT32, UInt32)
        COPY_VALUE(UINT64, UInt64)
        COPY_VALUE(FLOAT, Float)
        COPY_VALUE(DOUBLE, Double)
        COPY_VALUE(ENUM, Enum)
        COPY_VALUE(STRING, String)
#undef COPY_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          if (options.replace_message_fields()) {
            destination_reflection->ClearField(destination, field);
          }
          if (source_reflection->HasField(source, field)) {
            destination_reflection->MutableMessage(destination, field)
                ->MergeFrom(source_reflection->GetMessage(source, field));
          }
          break;
        }
      }
    } else {
      if (options.replace_repeated_fields()) {
        destination_reflection->ClearField(destination, field);
      }
      switch (field->cpp_type()) {
#define COPY_REPEATED_VALUE(TYPE, Name)                            \
  case FieldDescriptor::CPPTYPE_##TYPE: {                          \
    int size = source_reflection->FieldSize(source, field);        \
    for (int i = 0; i < size; ++i) {                               \
      destination_reflection->Add##Name(                           \
          destination, field,                                      \
          source_reflection->GetRepeated##Name(source, field, i)); \
    }                                                              \
    break;                                                         \
  }
        COPY_REPEATED_VALUE(BOOL, Bool)
        COPY_REPEATED_VALUE(INT32, Int32)
        COPY_REPEATED_VALUE(INT64, Int64)
        COPY_REPEATED_VALUE(UINT32, UInt32)
        COPY_REPEATED_VALUE(UINT64, UInt64)
        COPY_REPEATED_VALUE(FLOAT, Float)
        COPY_REPEATED_VALUE(DOUBLE, Double)
        COPY_REPEATED_VALUE(ENUM, Enum)
        COPY_REPEATED_VALUE(STRING, String)
#undef COPY_REPEATED_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          int size = source_reflection->FieldSize(source, field);
          for (int i = 0; i < size; ++i) {
            destination_reflection->AddMessage(destination, field)
                ->MergeFrom(
                    source_reflection->GetRepeatedMessage(source, field, i));
          }
          break;
        }
      }
    }
  }
}